

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O1

int ixmlElement_setAttributeNodeNS(IXML_Element *element,IXML_Attr *newAttr,IXML_Attr **rtAttr)

{
  char *__s2;
  Nodeptr p_Var1;
  int iVar2;
  Nodeptr p_Var3;
  IXML_Attr *pIVar4;
  
  iVar2 = 0x69;
  if (((newAttr != (IXML_Attr *)0x0 && element != (IXML_Element *)0x0) &&
      (iVar2 = 4, (newAttr->n).ownerDocument == (element->n).ownerDocument)) &&
     (iVar2 = 10, newAttr->ownerElement == (IXML_Element *)0x0 || newAttr->ownerElement == element))
  {
    newAttr->ownerElement = element;
    pIVar4 = (IXML_Attr *)(element->n).firstAttr;
    if (pIVar4 != (IXML_Attr *)0x0) {
      __s2 = (newAttr->n).localName;
      do {
        iVar2 = strcmp((pIVar4->n).localName,__s2);
        if (iVar2 == 0) {
          iVar2 = strcmp((pIVar4->n).namespaceURI,(newAttr->n).namespaceURI);
          if (iVar2 == 0) {
            p_Var1 = (pIVar4->n).prevSibling;
            p_Var3 = (pIVar4->n).nextSibling;
            if (p_Var1 != (Nodeptr)0x0) {
              p_Var1->nextSibling = &newAttr->n;
            }
            if (p_Var3 != (Nodeptr)0x0) {
              p_Var3->prevSibling = &newAttr->n;
            }
            if ((IXML_Attr *)(element->n).firstAttr == pIVar4) {
              (element->n).firstAttr = &newAttr->n;
            }
            goto LAB_001043e1;
          }
        }
        pIVar4 = (IXML_Attr *)(pIVar4->n).nextSibling;
      } while (pIVar4 != (IXML_Attr *)0x0);
    }
    p_Var1 = (element->n).firstAttr;
    if (p_Var1 == (Nodeptr)0x0) {
      (element->n).firstAttr = &newAttr->n;
      (newAttr->n).prevSibling = (Nodeptr)0x0;
      (newAttr->n).nextSibling = (Nodeptr)0x0;
    }
    else {
      do {
        p_Var3 = p_Var1;
        p_Var1 = p_Var3->nextSibling;
      } while (p_Var1 != (Nodeptr)0x0);
      p_Var3->nextSibling = &newAttr->n;
    }
    pIVar4 = (IXML_Attr *)0x0;
    iVar2 = 0;
    if (rtAttr != (IXML_Attr **)0x0) {
LAB_001043e1:
      *rtAttr = pIVar4;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ixmlElement_setAttributeNodeNS(
	/* IN */ IXML_Element *element,
	/* IN */ IXML_Attr *newAttr,
	/* OUT */ IXML_Attr **rtAttr)
{
	IXML_Node *attrNode = NULL;
	IXML_Node *node = NULL;
	IXML_Node *prevAttr = NULL;
	IXML_Node *nextAttr = NULL;
	IXML_Node *preSib = NULL;
	IXML_Node *nextSib = NULL;

	if (element == NULL || newAttr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (newAttr->n.ownerDocument != element->n.ownerDocument) {
		return IXML_WRONG_DOCUMENT_ERR;
	}

	if (newAttr->ownerElement != NULL && newAttr->ownerElement != element) {
		return IXML_INUSE_ATTRIBUTE_ERR;
	}

	newAttr->ownerElement = element;
	node = (IXML_Node *)newAttr;
	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->localName, node->localName) == 0 &&
			strcmp(attrNode->namespaceURI, node->namespaceURI) ==
				0) {
			/* Found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}
	if (attrNode != NULL) {
		/* already present, will replace by newAttr */
		preSib = attrNode->prevSibling;
		nextSib = attrNode->nextSibling;
		if (preSib != NULL) {
			preSib->nextSibling = node;
		}
		if (nextSib != NULL) {
			nextSib->prevSibling = node;
		}
		if (element->n.firstAttr == attrNode) {
			element->n.firstAttr = node;
		}
		*rtAttr = (IXML_Attr *)attrNode;

	} else {
		/* Add this attribute  */
		if (element->n.firstAttr != NULL) {
			/* Element has attribute already */
			prevAttr = element->n.firstAttr;
			nextAttr = prevAttr->nextSibling;
			while (nextAttr != NULL) {
				prevAttr = nextAttr;
				nextAttr = prevAttr->nextSibling;
			}
			prevAttr->nextSibling = node;
		} else {
			/* This is the first attribute node */
			element->n.firstAttr = node;
			node->prevSibling = NULL;
			node->nextSibling = NULL;
		}
		if (rtAttr != NULL) {
			*rtAttr = NULL;
		}
	}

	return IXML_SUCCESS;
}